

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  char *__s1;
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  FILE *__stream;
  undefined8 uVar6;
  ulong uVar7;
  uint *puVar8;
  REF_STATUS RVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  REF_CELL pRVar13;
  char *__s1_00;
  long lVar14;
  REF_INT new_cell;
  REF_INT face_id;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT new_node;
  REF_DBL swapped_dbl;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_INT nodes [27];
  undefined4 local_174;
  REF_GRID_conflict *local_170;
  REF_CELL local_168;
  uint local_15c;
  int local_158;
  uint local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  uint local_144;
  REF_DBL local_140;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  int local_e0;
  int local_dc;
  long local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  uint local_a8 [30];
  
  sVar5 = strlen(filename);
  iVar2 = strcmp(filename + (sVar5 - 10),".lb8.ugrid");
  if (iVar2 == 0) {
    uVar4 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar4 == 0) {
LAB_0014d957:
      uVar4 = ref_grid_inward_boundary_orientation(*ref_grid_ptr);
      if (uVar4 == 0) {
        return 0;
      }
      uVar10 = (ulong)uVar4;
      pcVar11 = "inward boundary orientation";
      uVar6 = 0x6e2;
    }
    else {
      uVar10 = (ulong)uVar4;
      pcVar11 = "lb8_ugrid failed";
      uVar6 = 0x6ad;
    }
  }
  else {
    iVar2 = strcmp(filename + (sVar5 - 9),".b8.ugrid");
    if (iVar2 == 0) {
      uVar4 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (uVar4 == 0) goto LAB_0014d957;
      uVar10 = (ulong)uVar4;
      pcVar11 = "b8_ugrid failed";
      uVar6 = 0x6b1;
    }
    else {
      local_170 = ref_grid_ptr;
      iVar2 = strcmp(filename + (sVar5 - 0xb),".lb8l.ugrid");
      ref_grid_ptr = local_170;
      if (iVar2 == 0) {
        uVar4 = ref_import_bin_ugrid(local_170,ref_mpi,filename,0,1);
        if (uVar4 == 0) goto LAB_0014d957;
        uVar10 = (ulong)uVar4;
        pcVar11 = "lb8_ugrid failed";
        uVar6 = 0x6b5;
      }
      else {
        iVar2 = strcmp(filename + (sVar5 - 10),".b8l.ugrid");
        ref_grid_ptr = local_170;
        if (iVar2 == 0) {
          uVar4 = ref_import_bin_ugrid(local_170,ref_mpi,filename,1,1);
          if (uVar4 == 0) goto LAB_0014d957;
          uVar10 = (ulong)uVar4;
          pcVar11 = "b8_ugrid failed";
          uVar6 = 0x6b9;
        }
        else {
          iVar2 = strcmp(filename + (sVar5 - 0xc),".lb8.ugrid64");
          ref_grid_ptr = local_170;
          if (iVar2 == 0) {
            uVar4 = ref_import_bin_ugrid(local_170,ref_mpi,filename,0,1);
            if (uVar4 == 0) goto LAB_0014d957;
            uVar10 = (ulong)uVar4;
            pcVar11 = "lb8_ugrid failed";
            uVar6 = 0x6bd;
          }
          else {
            iVar2 = strcmp(filename + (sVar5 - 0xb),".b8.ugrid64");
            ref_grid_ptr = local_170;
            if (iVar2 == 0) {
              uVar4 = ref_import_bin_ugrid(local_170,ref_mpi,filename,1,1);
              if (uVar4 == 0) goto LAB_0014d957;
              uVar10 = (ulong)uVar4;
              pcVar11 = "b8_ugrid failed";
              uVar6 = 0x6c1;
            }
            else {
              iVar2 = strcmp(filename + (sVar5 - 9),".r8.ugrid");
              ref_grid_ptr = local_170;
              if (iVar2 == 0) {
                uVar4 = ref_grid_create(local_170,ref_mpi);
                uVar10 = (ulong)uVar4;
                if (uVar4 == 0) {
                  pRVar1 = *ref_grid_ptr;
                  ref_node = pRVar1->node;
                  __stream = fopen(filename,"r");
                  if (__stream == (FILE *)0x0) {
                    printf("unable to open %s\n",filename);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x28c,"ref_import_r8_ugrid","unable to open file");
                    uVar10 = 2;
                  }
                  else {
                    sVar5 = fread(&local_174,4,1,__stream);
                    if (sVar5 == 1) {
                      uVar7 = (ulong)local_174._2_1_ << 8 |
                              (long)(local_174 << 0x18) | (ulong)local_174._1_1_ << 0x10 |
                              (ulong)local_174._3_1_;
                      local_174 = (int)uVar7;
                      if (local_174 != 0x1c) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x290,"ref_import_r8_ugrid","header start record size",0x1c,uVar7);
                        uVar10 = 1;
                        ref_grid_ptr = local_170;
                        goto LAB_0014d930;
                      }
                      sVar5 = fread(&local_148,4,1,__stream);
                      ref_grid_ptr = local_170;
                      if (sVar5 == 1) {
                        sVar5 = fread(&local_14c,4,1,__stream);
                        if (sVar5 == 1) {
                          sVar5 = fread(&local_150,4,1,__stream);
                          if (sVar5 == 1) {
                            sVar5 = fread(&local_124,4,1,__stream);
                            if (sVar5 == 1) {
                              sVar5 = fread(&local_128,4,1,__stream);
                              if (sVar5 == 1) {
                                sVar5 = fread(&local_12c,4,1,__stream);
                                if (sVar5 == 1) {
                                  sVar5 = fread(&local_130,4,1,__stream);
                                  if (sVar5 == 1) {
                                    sVar5 = fread(&local_174,4,1,__stream);
                                    if (sVar5 == 1) {
                                      uVar7 = (ulong)local_174._2_1_ << 8 |
                                              (long)(local_174 << 0x18) |
                                              (ulong)local_174._1_1_ << 0x10 |
                                              (ulong)local_174._3_1_;
                                      local_174 = (int)uVar7;
                                      if (local_174 == 0x1c) {
                                        local_b0 = (ulong)local_148._3_1_;
                                        iVar2 = local_148 * 0x1000000;
                                        local_b8 = (ulong)local_148._1_1_ << 0x10;
                                        local_168 = (REF_CELL)((ulong)local_148._2_1_ << 8);
                                        local_f8 = (long)(int)((int)local_b8 + iVar2 |
                                                              (uint)local_168) | local_b0;
                                        local_148 = (int)local_f8;
                                        local_e4 = local_14c >> 0x18;
                                        local_c0 = (ulong)(local_14c * 0x1000000);
                                        local_c8 = (ulong)local_14c._1_1_ << 0x10;
                                        local_e8 = (local_14c >> 0x10 & 0xff) << 8;
                                        local_14c = (int)local_c8 + local_14c * 0x1000000 | local_e8
                                                    | local_e4;
                                        local_118 = (ulong)local_14c;
                                        local_ec = local_150 >> 0x18;
                                        local_d0 = (ulong)(local_150 * 0x1000000);
                                        local_d8 = (ulong)local_150._1_1_ << 0x10;
                                        local_f0 = (local_150 >> 0x10 & 0xff) << 8;
                                        local_150 = (int)local_d8 + local_150 * 0x1000000 | local_f0
                                                    | local_ec;
                                        local_120 = (ulong)local_150;
                                        local_124 = local_124 >> 0x18 | (local_124 & 0xff0000) >> 8
                                                    | (local_124 & 0xff00) << 8 | local_124 << 0x18;
                                        local_100 = (ulong)local_124;
                                        local_128 = local_128 >> 0x18 | (local_128 & 0xff0000) >> 8
                                                    | (local_128 & 0xff00) << 8 | local_128 << 0x18;
                                        local_108 = (ulong)local_128;
                                        local_12c = local_12c >> 0x18 | (local_12c & 0xff0000) >> 8
                                                    | (local_12c & 0xff00) << 8 | local_12c << 0x18;
                                        local_110 = (ulong)local_12c;
                                        local_134 = local_130 >> 0x18 | (local_130 & 0xff0000) >> 8
                                                    | (local_130 & 0xff00) << 8 | local_130 << 0x18;
                                        local_130 = local_134;
                                        sVar5 = fread(&local_174,4,1,__stream);
                                        if (sVar5 != 1) {
                                          pcVar11 = "nnode";
                                          uVar6 = 0x2a6;
                                          goto LAB_0014d91f;
                                        }
                                        uVar7 = (ulong)local_174._2_1_ << 8 |
                                                (long)(local_174 << 0x18) |
                                                (ulong)local_174._1_1_ << 0x10 |
                                                (ulong)local_174._3_1_;
                                        iVar12 = (int)uVar7;
                                        local_158 = ((int)local_100 + (int)local_118) * 0x10 +
                                                    ((int)local_108 + (int)local_120) * 0x14 +
                                                    ((int)local_110 + (int)local_f8) * 0x18 +
                                                    local_134 * 0x20;
                                        local_174 = iVar12;
                                        if (local_158 != iVar12) {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                 ,0x2aa,"ref_import_r8_ugrid",
                                                 "block start record size",(long)local_158,uVar7);
                                          uVar10 = 1;
                                        }
                                        ref_grid_ptr = local_170;
                                        if (local_158 == iVar12) {
                                          if (0 < (int)local_f8) {
                                            local_168 = (REF_CELL)
                                                        (ulong)(uint)((int)local_168 + (int)local_b0
                                                                     + iVar2 + (int)local_b8);
                                            pRVar13 = (REF_CELL)0x0;
                                            do {
                                              uVar4 = ref_node_add(ref_node,(REF_GLOB)pRVar13,
                                                                   (REF_INT *)&local_144);
                                              if (uVar4 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2ad,"ref_import_r8_ugrid",(ulong)uVar4,
                                                  "new_node");
                                                uVar10 = (ulong)uVar4;
                                                ref_grid_ptr = local_170;
                                                goto LAB_0014d930;
                                              }
                                              if (pRVar13 != (REF_CELL)(ulong)local_144) {
                                                pcVar11 = "node index";
                                                uVar6 = 0x2ae;
                                                goto LAB_0014d91f;
                                              }
                                              sVar5 = fread(&local_140,8,1,__stream);
                                              if (sVar5 != 1) {
                                                pcVar11 = "x";
                                                uVar6 = 0x2af;
                                                goto LAB_0014d91f;
                                              }
                                              local_140 = (REF_DBL)((ulong)local_140 >> 0x38 |
                                                                    ((ulong)local_140 &
                                                                    0xff000000000000) >> 0x28 |
                                                                    ((ulong)local_140 &
                                                                    0xff0000000000) >> 0x18 |
                                                                    ((ulong)local_140 & 0xff00000000
                                                                    ) >> 8 | ((ulong)local_140 &
                                                                             0xff000000) << 8 |
                                                                    ((ulong)local_140 & 0xff0000) <<
                                                                    0x18 | ((ulong)local_140 &
                                                                           0xff00) << 0x28 |
                                                                   (long)local_140 << 0x38);
                                              ref_node->real[(long)(int)local_144 * 0xf] = local_140
                                              ;
                                              sVar5 = fread(&local_140,8,1,__stream);
                                              if (sVar5 != 1) {
                                                pcVar11 = "y";
                                                uVar6 = 0x2b2;
                                                goto LAB_0014d91f;
                                              }
                                              local_140 = (REF_DBL)((ulong)local_140 >> 0x38 |
                                                                    ((ulong)local_140 &
                                                                    0xff000000000000) >> 0x28 |
                                                                    ((ulong)local_140 &
                                                                    0xff0000000000) >> 0x18 |
                                                                    ((ulong)local_140 & 0xff00000000
                                                                    ) >> 8 | ((ulong)local_140 &
                                                                             0xff000000) << 8 |
                                                                    ((ulong)local_140 & 0xff0000) <<
                                                                    0x18 | ((ulong)local_140 &
                                                                           0xff00) << 0x28 |
                                                                   (long)local_140 << 0x38);
                                              ref_node->real[(long)(int)local_144 * 0xf + 1] =
                                                   local_140;
                                              sVar5 = fread(&local_140,8,1,__stream);
                                              if (sVar5 != 1) {
                                                pcVar11 = "z";
                                                uVar6 = 0x2b5;
                                                goto LAB_0014d91f;
                                              }
                                              local_140 = (REF_DBL)((ulong)local_140 >> 0x38 |
                                                                    ((ulong)local_140 &
                                                                    0xff000000000000) >> 0x28 |
                                                                    ((ulong)local_140 &
                                                                    0xff0000000000) >> 0x18 |
                                                                    ((ulong)local_140 & 0xff00000000
                                                                    ) >> 8 | ((ulong)local_140 &
                                                                             0xff000000) << 8 |
                                                                    ((ulong)local_140 & 0xff0000) <<
                                                                    0x18 | ((ulong)local_140 &
                                                                           0xff00) << 0x28 |
                                                                   (long)local_140 << 0x38);
                                              ref_node->real[(long)(int)local_144 * 0xf + 2] =
                                                   local_140;
                                              pRVar13 = (REF_CELL)((long)&pRVar13->type + 1);
                                            } while (local_168 != pRVar13);
                                          }
                                          uVar4 = ref_node_initialize_n_global(ref_node,local_f8);
                                          if (uVar4 == 0) {
                                            local_168 = pRVar1->cell[3];
                                            local_a8[3] = 0xffffffff;
                                            if (0 < (int)local_118) {
                                              iVar2 = 0;
                                              do {
                                                lVar14 = (long)local_168->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "tri";
                                                      uVar6 = 0x2c1;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar4 = *puVar8;
                                                    *puVar8 = (uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar4 = ref_cell_add(local_168,(REF_INT *)local_a8,
                                                                     &local_dc);
                                                if (uVar4 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2c5,"ref_import_r8_ugrid",(ulong)uVar4,
                                                  "new tri");
                                                  uVar10 = (ulong)uVar4;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (iVar2 != local_dc) {
                                                  pcVar11 = "tri index";
                                                  uVar6 = 0x2c6;
                                                  goto LAB_0014d91f;
                                                }
                                                iVar2 = iVar2 + 1;
                                              } while (iVar2 != (int)local_118);
                                            }
                                            local_168 = pRVar1->cell[6];
                                            local_a8[4] = 0xffffffff;
                                            if (0 < (int)local_120) {
                                              iVar2 = 0;
                                              do {
                                                lVar14 = (long)local_168->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "qua";
                                                      uVar6 = 0x2ce;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar4 = *puVar8;
                                                    *puVar8 = (uVar4 >> 0x18 |
                                                               (uVar4 & 0xff0000) >> 8 |
                                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar4 = ref_cell_add(local_168,(REF_INT *)local_a8,
                                                                     &local_e0);
                                                if (uVar4 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2d2,"ref_import_r8_ugrid",(ulong)uVar4,
                                                  "new qua");
                                                  uVar10 = (ulong)uVar4;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (iVar2 != local_e0) {
                                                  pcVar11 = "qua index";
                                                  uVar6 = 0x2d3;
                                                  goto LAB_0014d91f;
                                                }
                                                iVar2 = iVar2 + 1;
                                              } while (iVar2 != (int)local_120);
                                            }
                                            if (0 < (int)local_118) {
                                              pRVar13 = pRVar1->cell[3];
                                              iVar2 = (int)local_c0 + (int)local_c8 + local_e8 +
                                                      local_e4;
                                              iVar12 = 0;
                                              do {
                                                sVar5 = fread(&local_154,4,1,__stream);
                                                if (sVar5 != 1) {
                                                  pcVar11 = "tri";
                                                  uVar6 = 0x2d8;
                                                  goto LAB_0014d91f;
                                                }
                                                local_154 = local_154 >> 0x18 |
                                                            (local_154 & 0xff0000) >> 8 |
                                                            (local_154 & 0xff00) << 8 |
                                                            local_154 << 0x18;
                                                pRVar13->c2n
                                                [(long)pRVar13->size_per * (long)iVar12 + 3] =
                                                     local_154;
                                                iVar12 = iVar12 + 1;
                                              } while (iVar2 != iVar12);
                                            }
                                            if (0 < (int)local_120) {
                                              pRVar13 = pRVar1->cell[6];
                                              iVar2 = (int)local_d0 + (int)local_d8 + local_f0 +
                                                      local_ec;
                                              iVar12 = 0;
                                              do {
                                                sVar5 = fread(&local_154,4,1,__stream);
                                                if (sVar5 != 1) {
                                                  pcVar11 = "qua";
                                                  uVar6 = 0x2df;
                                                  goto LAB_0014d91f;
                                                }
                                                local_154 = local_154 >> 0x18 |
                                                            (local_154 & 0xff0000) >> 8 |
                                                            (local_154 & 0xff00) << 8 |
                                                            local_154 << 0x18;
                                                pRVar13->c2n
                                                [(long)pRVar13->size_per * (long)iVar12 + 4] =
                                                     local_154;
                                                iVar12 = iVar12 + 1;
                                              } while (iVar2 != iVar12);
                                            }
                                            if (0 < (int)(uint)local_100) {
                                              local_168 = pRVar1->cell[8];
                                              uVar4 = 0;
                                              do {
                                                lVar14 = (long)local_168->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "tet";
                                                      uVar6 = 0x2e8;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar3 = *puVar8;
                                                    *puVar8 = (uVar3 >> 0x18 |
                                                               (uVar3 & 0xff0000) >> 8 |
                                                               (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar3 = ref_cell_add(local_168,(REF_INT *)local_a8,
                                                                     (REF_INT *)&local_15c);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2ec,"ref_import_r8_ugrid",(ulong)uVar3,
                                                  "tet cell");
                                                  uVar10 = (ulong)uVar3;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (uVar4 != local_15c) {
                                                  pcVar11 = "tet index";
                                                  uVar6 = 0x2ed;
                                                  goto LAB_0014d91f;
                                                }
                                                uVar4 = uVar4 + 1;
                                              } while (uVar4 != (uint)local_100);
                                            }
                                            if (0 < (int)(uint)local_108) {
                                              local_168 = pRVar1->cell[9];
                                              uVar4 = 0;
                                              do {
                                                lVar14 = (long)local_168->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "pyr";
                                                      uVar6 = 0x2f4;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar3 = *puVar8;
                                                    *puVar8 = (uVar3 >> 0x18 |
                                                               (uVar3 & 0xff0000) >> 8 |
                                                               (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar3 = ref_cell_add(local_168,(REF_INT *)local_a8,
                                                                     (REF_INT *)&local_15c);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2f8,"ref_import_r8_ugrid",(ulong)uVar3,
                                                  "pyr cell");
                                                  uVar10 = (ulong)uVar3;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (uVar4 != local_15c) {
                                                  pcVar11 = "pyr index";
                                                  uVar6 = 0x2f9;
                                                  goto LAB_0014d91f;
                                                }
                                                uVar4 = uVar4 + 1;
                                              } while (uVar4 != (uint)local_108);
                                            }
                                            if (0 < (int)(uint)local_110) {
                                              local_168 = pRVar1->cell[10];
                                              uVar4 = 0;
                                              do {
                                                lVar14 = (long)local_168->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "pri";
                                                      uVar6 = 0x300;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar3 = *puVar8;
                                                    *puVar8 = (uVar3 >> 0x18 |
                                                               (uVar3 & 0xff0000) >> 8 |
                                                               (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar3 = ref_cell_add(local_168,(REF_INT *)local_a8,
                                                                     (REF_INT *)&local_15c);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x304,"ref_import_r8_ugrid",(ulong)uVar3,
                                                  "pri cell");
                                                  uVar10 = (ulong)uVar3;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (uVar4 != local_15c) {
                                                  pcVar11 = "pri index";
                                                  uVar6 = 0x305;
                                                  goto LAB_0014d91f;
                                                }
                                                uVar4 = uVar4 + 1;
                                              } while (uVar4 != (uint)local_110);
                                            }
                                            if (0 < (int)local_134) {
                                              pRVar13 = pRVar1->cell[0xb];
                                              uVar4 = 0;
                                              do {
                                                lVar14 = (long)pRVar13->node_per;
                                                if (0 < lVar14) {
                                                  puVar8 = local_a8;
                                                  do {
                                                    sVar5 = fread(puVar8,4,1,__stream);
                                                    if (sVar5 != 1) {
                                                      pcVar11 = "hex";
                                                      uVar6 = 0x30c;
                                                      goto LAB_0014d91f;
                                                    }
                                                    uVar3 = *puVar8;
                                                    *puVar8 = (uVar3 >> 0x18 |
                                                               (uVar3 & 0xff0000) >> 8 |
                                                               (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                                                              ) - 1;
                                                    puVar8 = puVar8 + 1;
                                                    lVar14 = lVar14 + -1;
                                                  } while (lVar14 != 0);
                                                }
                                                uVar3 = ref_cell_add(pRVar13,(REF_INT *)local_a8,
                                                                     (REF_INT *)&local_15c);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x310,"ref_import_r8_ugrid",(ulong)uVar3,
                                                  "hex cell");
                                                  uVar10 = (ulong)uVar3;
                                                  ref_grid_ptr = local_170;
                                                  goto LAB_0014d930;
                                                }
                                                if (uVar4 != local_15c) {
                                                  pcVar11 = "hex index";
                                                  uVar6 = 0x311;
                                                  goto LAB_0014d91f;
                                                }
                                                uVar4 = uVar4 + 1;
                                              } while (uVar4 != local_134);
                                            }
                                            sVar5 = fread(&local_174,4,1,__stream);
                                            if (sVar5 != 1) {
                                              pcVar11 = "nnode";
                                              uVar6 = 0x314;
                                              goto LAB_0014d91f;
                                            }
                                            uVar7 = (ulong)local_174._2_1_ << 8 |
                                                    (long)(local_174 << 0x18) |
                                                    (ulong)local_174._1_1_ << 0x10 |
                                                    (ulong)local_174._3_1_;
                                            iVar2 = (int)uVar7;
                                            local_174 = iVar2;
                                            if (local_158 != iVar2) {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x318,"ref_import_r8_ugrid",
                                                  "block end record size",(long)local_158,uVar7);
                                              uVar10 = 1;
                                            }
                                            ref_grid_ptr = local_170;
                                            if (local_158 == iVar2) {
                                              fclose(__stream);
                                              uVar10 = 0;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                  ,0x2ba,"ref_import_r8_ugrid",(ulong)uVar4,
                                                  "init glob");
                                            uVar10 = (ulong)uVar4;
                                            ref_grid_ptr = local_170;
                                          }
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x29c,"ref_import_r8_ugrid","header end record size"
                                               ,0x1c,uVar7);
                                        uVar10 = 1;
                                        ref_grid_ptr = local_170;
                                      }
                                      goto LAB_0014d930;
                                    }
                                    pcVar11 = "nnode";
                                    uVar6 = 0x29a;
                                  }
                                  else {
                                    pcVar11 = "nhex";
                                    uVar6 = 0x298;
                                  }
                                }
                                else {
                                  pcVar11 = "npri";
                                  uVar6 = 0x297;
                                }
LAB_0014d91f:
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,uVar6,"ref_import_r8_ugrid",pcVar11);
                                uVar10 = 1;
                                ref_grid_ptr = local_170;
                                goto LAB_0014d930;
                              }
                              pcVar11 = "npyr";
                              uVar6 = 0x296;
                            }
                            else {
                              pcVar11 = "ntet";
                              uVar6 = 0x295;
                            }
                          }
                          else {
                            pcVar11 = "nqua";
                            uVar6 = 0x294;
                          }
                        }
                        else {
                          pcVar11 = "ntri";
                          uVar6 = 0x293;
                        }
                      }
                      else {
                        pcVar11 = "nnode";
                        uVar6 = 0x292;
                      }
                    }
                    else {
                      pcVar11 = "nnode";
                      uVar6 = 0x28e;
                    }
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,uVar6,"ref_import_r8_ugrid",pcVar11);
                    uVar10 = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x286,"ref_import_r8_ugrid",(ulong)uVar4,"create grid");
                }
LAB_0014d930:
                if ((int)uVar10 == 0) goto LAB_0014d957;
                pcVar11 = "r8_ugrid failed";
                uVar6 = 0x6c4;
              }
              else {
                pcVar11 = filename + (sVar5 - 6);
                iVar2 = strcmp(pcVar11,".ugrid");
                if (iVar2 == 0) {
                  uVar4 = ref_import_ugrid(ref_grid_ptr,ref_mpi,filename);
                  if (uVar4 == 0) goto LAB_0014d957;
                  uVar10 = (ulong)uVar4;
                  pcVar11 = "ugrid failed";
                  uVar6 = 0x6c6;
                }
                else {
                  __s1 = filename + (sVar5 - 4);
                  iVar2 = strcmp(__s1,".tri");
                  if (iVar2 == 0) {
                    uVar4 = ref_import_tri(ref_grid_ptr,ref_mpi,filename);
                    if (uVar4 == 0) goto LAB_0014d957;
                    uVar10 = (ulong)uVar4;
                    pcVar11 = "tri failed";
                    uVar6 = 0x6c8;
                  }
                  else {
                    __s1_00 = filename + (sVar5 - 5);
                    iVar2 = strcmp(__s1_00,".surf");
                    if (iVar2 == 0) {
                      uVar4 = ref_import_surf(ref_grid_ptr,ref_mpi,filename);
                      if (uVar4 == 0) goto LAB_0014d957;
                      uVar10 = (ulong)uVar4;
                      pcVar11 = "surf failed";
                      uVar6 = 0x6ca;
                    }
                    else {
                      iVar2 = strcmp(pcVar11,".fgrid");
                      if (iVar2 == 0) {
                        uVar4 = ref_import_fgrid(ref_grid_ptr,ref_mpi,filename);
                        if (uVar4 == 0) goto LAB_0014d957;
                        uVar10 = (ulong)uVar4;
                        pcVar11 = "fgrid failed";
                        uVar6 = 0x6cc;
                      }
                      else {
                        iVar2 = strcmp(__s1,".su2");
                        if (iVar2 == 0) {
                          uVar4 = ref_import_su2(ref_grid_ptr,ref_mpi,filename);
                          if (uVar4 == 0) goto LAB_0014d957;
                          uVar10 = (ulong)uVar4;
                          pcVar11 = "su2 failed";
                          uVar6 = 0x6ce;
                        }
                        else {
                          iVar2 = strcmp(__s1,".msh");
                          if (iVar2 == 0) {
                            uVar4 = ref_import_msh(ref_grid_ptr,ref_mpi,filename);
                            if (uVar4 == 0) goto LAB_0014d957;
                            uVar10 = (ulong)uVar4;
                            pcVar11 = "msh failed";
                            uVar6 = 0x6d0;
                          }
                          else {
                            iVar2 = strcmp(__s1_00,".node");
                            if (iVar2 == 0) {
                              uVar4 = ref_import_tetgen_node(ref_grid_ptr,ref_mpi,filename);
                              if (uVar4 == 0) goto LAB_0014d957;
                              uVar10 = (ulong)uVar4;
                              pcVar11 = "tetgen node failed";
                              uVar6 = 0x6d3;
                            }
                            else {
                              iVar2 = strcmp(pcVar11,".meshb");
                              if (iVar2 == 0) {
                                uVar4 = ref_import_meshb(ref_grid_ptr,ref_mpi,filename);
                                if (uVar4 == 0) goto LAB_0014d957;
                                uVar10 = (ulong)uVar4;
                                pcVar11 = "meshb failed";
                                uVar6 = 0x6d5;
                              }
                              else {
                                iVar2 = strcmp(__s1_00,".grid");
                                if (iVar2 == 0) {
                                  uVar4 = ref_import_i_like_cfd_grid(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar4 == 0) goto LAB_0014d957;
                                  uVar10 = (ulong)uVar4;
                                  pcVar11 = "I Like CFD grid failed";
                                  uVar6 = 0x6d8;
                                }
                                else {
                                  iVar2 = strcmp(__s1,".avm");
                                  if (iVar2 != 0) {
                                    printf("%s: %d: %s %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6dc,"input file name extension unknown",filename);
                                    pcVar11 = "unknown file extension";
                                    RVar9 = 1;
                                    uVar6 = 0x6de;
                                    uVar10 = 1;
                                    goto LAB_0014d989;
                                  }
                                  uVar4 = ref_part_by_extension(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar4 == 0) goto LAB_0014d957;
                                  uVar10 = (ulong)uVar4;
                                  pcVar11 = "part failed";
                                  uVar6 = 0x6da;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  RVar9 = (REF_STATUS)uVar10;
LAB_0014d989:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar6,
         "ref_import_by_extension",uVar10,pcVar11);
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_import_by_extension(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_FALSE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_FALSE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".r8.ugrid") == 0) {
    RSS(ref_import_r8_ugrid(ref_grid_ptr, ref_mpi, filename),
        "r8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_import_ugrid(ref_grid_ptr, ref_mpi, filename), "ugrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_import_tri(ref_grid_ptr, ref_mpi, filename), "tri failed");
  } else if (strcmp(&filename[end_of_string - 5], ".surf") == 0) {
    RSS(ref_import_surf(ref_grid_ptr, ref_mpi, filename), "surf failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_import_fgrid(ref_grid_ptr, ref_mpi, filename), "fgrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_import_su2(ref_grid_ptr, ref_mpi, filename), "su2 failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_import_msh(ref_grid_ptr, ref_mpi, filename), "msh failed");
  } else if (strcmp(&filename[end_of_string - 5], ".node") == 0) {
    RSS(ref_import_tetgen_node(ref_grid_ptr, ref_mpi, filename),
        "tetgen node failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_import_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_import_i_like_cfd_grid(ref_grid_ptr, ref_mpi, filename),
        "I Like CFD grid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_by_extension(ref_grid_ptr, ref_mpi, filename), "part failed");
  } else {
    printf("%s: %d: %s %s\n", __FILE__, __LINE__,
           "input file name extension unknown", filename);
    RSS(REF_FAILURE, "unknown file extension");
  }

  RSS(ref_grid_inward_boundary_orientation(*ref_grid_ptr),
      "inward boundary orientation");

  return REF_SUCCESS;
}